

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O1

Vec_Wrd_t * Lms_GiaDelays(Gia_Man_t *p)

{
  Vec_Wrd_t *p_00;
  word *pwVar1;
  Vec_Wrd_t *p_01;
  Vec_Int_t *pVVar2;
  byte bVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  
  iVar13 = p->nObjs;
  p_00 = (Vec_Wrd_t *)malloc(0x10);
  iVar4 = 0x10;
  if (0xe < iVar13 - 1U) {
    iVar4 = iVar13;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar4;
  if (iVar4 == 0) {
    pwVar1 = (word *)0x0;
  }
  else {
    pwVar1 = (word *)malloc((long)iVar4 << 3);
  }
  p_00->pArray = pwVar1;
  Vec_WrdPush(p_00,0);
  if (1 < p->nObjs) {
    lVar14 = 1;
    do {
      uVar8 = *(ulong *)(p->pObjs + lVar14);
      uVar6 = (uint)uVar8;
      iVar13 = (int)lVar14;
      uVar7 = (uint)(uVar8 >> 0x20);
      if ((uVar8 & 0x1fffffff) == 0x1fffffff || (int)uVar6 < 0) {
        if ((int)uVar6 < 0 && (int)(uVar8 & 0x1fffffff) != 0x1fffffff) {
          uVar6 = iVar13 - (uVar6 & 0x1fffffff);
          if (((int)uVar6 < 0) || (p_00->nSize <= (int)uVar6)) goto LAB_002f3f7e;
          iVar13 = p->vCis->nSize;
          if ((long)iVar13 < 1) goto LAB_002f3e71;
          if (iVar13 - 0x11U < 0xfffffff0) goto LAB_002f3fbc;
          lVar5 = 0;
          uVar8 = 0;
          do {
            uVar9 = p_00->pArray[uVar6] >> ((byte)lVar5 & 0x3f);
            uVar10 = 0;
            if ((uVar9 & 0xf) != 0) {
              uVar10 = (ulong)(((uint)uVar9 & 0xf) - 1) << ((byte)lVar5 & 0x3f);
            }
            uVar8 = uVar8 | uVar10;
            lVar5 = lVar5 + 4;
          } while ((long)iVar13 * 4 != lVar5);
        }
        else {
          if ((~uVar6 & 0x9fffffff) != 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                          ,0xae,"Vec_Wrd_t *Lms_GiaDelays(Gia_Man_t *)");
          }
          if (-1 < (int)uVar6) {
            __assert_fail("pObj->fTerm",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1da,"int Gia_ObjCioId(Gia_Obj_t *)");
          }
          uVar7 = uVar7 & 0x1fffffff;
          if (0xf < uVar7) {
            __assert_fail("v >= 0 && v < LMS_VAR_MAX",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                          ,0x73,"word Lms_DelayInit(int)");
          }
          uVar8 = 1L << ((byte)(uVar7 << 2) & 0x3f);
        }
      }
      else {
        uVar6 = iVar13 - (uVar6 & 0x1fffffff);
        if (((((int)uVar6 < 0) || (p_00->nSize <= (int)uVar6)) ||
            (uVar7 = iVar13 - (uVar7 & 0x1fffffff), (int)uVar7 < 0)) || (p_00->nSize <= (int)uVar7))
        goto LAB_002f3f7e;
        iVar13 = p->vCis->nSize;
        if ((long)iVar13 < 1) {
LAB_002f3e71:
          uVar8 = 0;
        }
        else {
          if (iVar13 - 0x11U < 0xfffffff0) {
LAB_002f3fbc:
            __assert_fail("v >= 0 && v < LMS_VAR_MAX",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                          ,0x71,"int Lms_DelayGet(word, int)");
          }
          lVar5 = 0;
          uVar8 = 0;
          do {
            bVar3 = (byte)lVar5;
            uVar12 = (uint)(p_00->pArray[uVar6] >> (bVar3 & 0x3f)) & 0xf;
            uVar11 = (uint)(p_00->pArray[uVar7] >> (bVar3 & 0x3f)) & 0xf;
            if (uVar11 < uVar12) {
              uVar11 = uVar12;
            }
            if (uVar11 != 0) {
              if (0xd < uVar11) {
                uVar11 = 0xe;
              }
              uVar8 = uVar8 | (ulong)uVar11 + 1 << (bVar3 & 0x3f);
            }
            lVar5 = lVar5 + 4;
          } while ((long)iVar13 * 4 != lVar5);
        }
      }
      Vec_WrdPush(p_00,uVar8);
      lVar14 = lVar14 + 1;
    } while (lVar14 < p->nObjs);
  }
  iVar13 = p->vCos->nSize;
  p_01 = (Vec_Wrd_t *)malloc(0x10);
  iVar4 = 0x10;
  if (0xe < iVar13 - 1U) {
    iVar4 = iVar13;
  }
  p_01->nSize = 0;
  p_01->nCap = iVar4;
  if (iVar4 == 0) {
    pwVar1 = (word *)0x0;
  }
  else {
    pwVar1 = (word *)malloc((long)iVar4 << 3);
  }
  p_01->pArray = pwVar1;
  pVVar2 = p->vCos;
  if (0 < pVVar2->nSize) {
    lVar14 = 0;
    do {
      iVar13 = pVVar2->pArray[lVar14];
      if (((long)iVar13 < 0) || (p->nObjs <= iVar13)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if (p_00->nSize <= iVar13) {
LAB_002f3f7e:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                      ,0x1ad,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
      }
      Vec_WrdPush(p_01,p_00->pArray[iVar13]);
      lVar14 = lVar14 + 1;
      pVVar2 = p->vCos;
    } while (lVar14 < pVVar2->nSize);
  }
  if (p_00->pArray != (word *)0x0) {
    free(p_00->pArray);
    p_00->pArray = (word *)0x0;
  }
  free(p_00);
  return p_01;
}

Assistant:

Vec_Wrd_t * Lms_GiaDelays( Gia_Man_t * p )
{
    Vec_Wrd_t * vDelays, * vResult;
    Gia_Obj_t * pObj;
    int i;
    // compute delay profiles of all objects
    vDelays = Vec_WrdAlloc( Gia_ManObjNum(p) );
    Vec_WrdPush( vDelays, 0 ); // const 0
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            Vec_WrdPush( vDelays, Lms_DelayMax( Vec_WrdEntry(vDelays, Gia_ObjFaninId0(pObj, i)), Vec_WrdEntry(vDelays, Gia_ObjFaninId1(pObj, i)), Gia_ManCiNum(p) ) );
        else if ( Gia_ObjIsCo(pObj) )
            Vec_WrdPush( vDelays, Lms_DelayDecrement( Vec_WrdEntry(vDelays, Gia_ObjFaninId0(pObj, i)), Gia_ManCiNum(p) ) );
        else if ( Gia_ObjIsCi(pObj) )
            Vec_WrdPush( vDelays, Lms_DelayInit( Gia_ObjCioId(pObj) ) );
        else assert( 0 );
    }
    // collect delay profiles of COs only
    vResult = Vec_WrdAlloc( Gia_ManCoNum(p) );
    Gia_ManForEachCo( p, pObj, i )
        Vec_WrdPush( vResult, Vec_WrdEntry(vDelays, Gia_ObjId(p, pObj)) );
    Vec_WrdFree( vDelays );
    return vResult;
}